

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::init_log(Solver *this)

{
  string prefix;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  get_log_file(&local_90,&(this->hyper_param_).log_file);
  std::__cxx11::string::append((char *)&local_90);
  StringPrintf_abi_cxx11_(&local_30,"%s.INFO",local_90._M_dataplus._M_p);
  StringPrintf_abi_cxx11_(&local_50,"%s.WARN",local_90._M_dataplus._M_p);
  StringPrintf_abi_cxx11_(&local_70,"%s.ERROR",local_90._M_dataplus._M_p);
  InitializeLogger(&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Solver::init_log() {
  std::string prefix = get_log_file(hyper_param_.log_file);
  if (hyper_param_.is_train) {
    prefix += "_train";
  } else {
    prefix += "_predict";
  }
  InitializeLogger(StringPrintf("%s.INFO", prefix.c_str()),
              StringPrintf("%s.WARN", prefix.c_str()),
              StringPrintf("%s.ERROR", prefix.c_str()));
}